

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgeType __thiscall ON_SubDEdge::EdgeType(ON_SubDEdge *this)

{
  float fVar1;
  float fVar2;
  ON_SubDEdgeTag OVar3;
  ushort uVar4;
  ON_SubDEdgeType OVar5;
  
  uVar4 = this->m_face_count;
  if (uVar4 == 2) {
    OVar3 = this->m_edge_tag;
    if (OVar3 != SmoothX) {
      if (OVar3 == Crease) {
        return InteriorCrease;
      }
      if (OVar3 != Smooth) {
        return Invalid;
      }
    }
    fVar1 = (this->m_sharpness).m_edge_sharpness[0];
    fVar2 = (this->m_sharpness).m_edge_sharpness[1];
    if ((((fVar1 == 0.0) && (!NAN(fVar1))) && (fVar2 == 0.0)) && (!NAN(fVar2))) {
      return InteriorSmooth;
    }
    if (((0.0 <= fVar1) && (0.0 < fVar1 || 0.0 < fVar2)) &&
       ((fVar1 <= 4.0 && ((0.0 <= fVar2 && (fVar2 <= 4.0)))))) {
      return InteriorSharp;
    }
  }
  else {
    if (uVar4 == 1) {
      OVar5 = Boundary;
    }
    else if (uVar4 == 0) {
      OVar5 = Wire;
    }
    else {
      if (0xfff0 < uVar4) {
        return Invalid;
      }
      OVar5 = Nonmanifold;
    }
    if (this->m_edge_tag == Crease) {
      return OVar5;
    }
  }
  return Invalid;
}

Assistant:

ON_SubDEdgeType ON_SubDEdge::EdgeType() const
{
  if (0 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Wire;
  }
  else if (1 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Boundary;
  }
  else if (2 == m_face_count)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::InteriorCrease;
    
    if (ON_SubDEdgeTag::Smooth == m_edge_tag || ON_SubDEdgeTag::SmoothX == m_edge_tag)
    {
      if (this->m_sharpness.IsZero())
        return ON_SubDEdgeType::InteriorSmooth;
      if (this->m_sharpness.IsSharp())
        return ON_SubDEdgeType::InteriorSharp;
    }
  }
  else if (m_face_count <= ON_SubDEdge::MaximumFaceCount)
  {
    if (ON_SubDEdgeTag::Crease == m_edge_tag)
      return ON_SubDEdgeType::Nonmanifold;
  }

  return ON_SubDEdgeType::Invalid;
}